

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O0

uint64_t arena_decay_compute_purge_interval_impl
                   (tsdn_t *tsdn,arena_decay_t *decay,extents_t *extents)

{
  undefined1 auVar1 [16];
  _Bool _Var2;
  uint64_t uVar3;
  size_t sVar4;
  tsdn_t *interval_00;
  extents_t *in_RDX;
  arena_decay_t *in_RSI;
  bool bVar5;
  bool bVar6;
  size_t npurge;
  size_t target;
  uint n_search;
  size_t npurge_ub;
  size_t npurge_lb;
  size_t ub;
  size_t lb;
  uint i;
  size_t npages;
  uint64_t decay_interval_ns;
  ssize_t decay_time;
  uint64_t interval;
  ssize_t result;
  uint64_t uStackY_d0;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  tsdn_t *in_stack_ffffffffffffff40;
  ulong uStack_88;
  size_t sStack_80;
  tsdn_t *ptStack_78;
  tsdn_t *ptStack_70;
  uint uStack_64;
  ulong uStack_48;
  
  _Var2 = malloc_mutex_trylock
                    (in_stack_ffffffffffffff40,
                     (malloc_mutex_t *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38)
                    );
  if (_Var2) {
    return 100000000;
  }
  if ((in_RSI->time_ms).repr < 1) {
    uStack_48 = 0xffffffffffffffff;
  }
  else {
    uVar3 = nstime_ns(&in_RSI->interval);
    sVar4 = extents_npages_get(in_RDX);
    if (sVar4 == 0) {
      for (uStack_64 = 0; (uStack_64 < 200 && (in_RSI->backlog[uStack_64] == 0));
          uStack_64 = uStack_64 + 1) {
      }
      if (uStack_64 == 200) {
        uStack_48 = 0xffffffffffffffff;
        goto code_r0x00127ead;
      }
    }
    if (sVar4 < 0x401) {
      uStack_48 = uVar3 * 200;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar3;
      interval_00 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(100000000)) / auVar1,0);
      ptStack_78 = (tsdn_t *)0xc8;
      if (interval_00 < (tsdn_t *)0x2) {
        interval_00 = (tsdn_t *)0x2;
      }
      in_stack_ffffffffffffff40 = interval_00;
      if ((uVar3 * 200 < 0x5f5e101) ||
         ((_Bool *)0xc8 <
          &(interval_00->tsd).
           cant_access_tsd_items_directly_use_a_getter_or_setter_arenas_tdata_bypass)) {
        uStack_48 = 100000000;
      }
      else {
        sVar4 = decay_npurge_after_interval(in_RSI,(size_t)interval_00);
        if (sVar4 < 0x401) {
          uStack_88 = decay_npurge_after_interval(in_RSI,200);
          if (uStack_88 < 0x400) {
            uStack_48 = uVar3 * 200;
          }
          else {
            while (ptStack_70 = interval_00, sStack_80 = sVar4,
                  bVar5 = sStack_80 + 0x400 < uStack_88,
                  bVar6 = &(ptStack_70->tsd).
                           cant_access_tsd_items_directly_use_a_getter_or_setter_arenas_tdata_bypass
                          < ptStack_78, in_stack_ffffffffffffff3f = bVar5 && bVar6, bVar5 && bVar6)
            {
              interval_00 = (tsdn_t *)
                            ((ulong)((long)&(ptStack_78->tsd).
                                            cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx
                                    + (long)((ptStack_70->tsd).
                                             cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx
                                             .cache + 0x12 + -0x15) + 0xffffffffffffffd0U) >> 1);
              sVar4 = decay_npurge_after_interval(in_RSI,(size_t)interval_00);
              if (0x400 < sVar4) {
                uStack_88 = sVar4;
                sVar4 = sStack_80;
                ptStack_78 = interval_00;
                interval_00 = ptStack_70;
              }
            }
            uStack_48 = uVar3 * ((long)&(ptStack_70->tsd).
                                        cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx
                                + (long)((ptStack_78->tsd).
                                         cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx
                                         .cache + 0x12 + -0x15) + 0xffffffffffffffd0U) >> 1;
          }
        }
        else {
          uStack_48 = uVar3 * (long)interval_00;
        }
      }
    }
  }
code_r0x00127ead:
  if (uStack_48 < 100000000) {
    uStackY_d0 = 100000000;
  }
  else {
    uStackY_d0 = uStack_48;
  }
  malloc_mutex_unlock(in_stack_ffffffffffffff40,
                      (malloc_mutex_t *)
                      CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  return uStackY_d0;
}

Assistant:

static uint64_t
arena_decay_compute_purge_interval_impl(tsdn_t *tsdn, arena_decay_t *decay,
    extents_t *extents) {
	if (malloc_mutex_trylock(tsdn, &decay->mtx)) {
		/* Use minimal interval if decay is contended. */
		return BACKGROUND_THREAD_MIN_INTERVAL_NS;
	}

	uint64_t interval;
	ssize_t decay_time = atomic_load_zd(&decay->time_ms, ATOMIC_RELAXED);
	if (decay_time <= 0) {
		/* Purging is eagerly done or disabled currently. */
		interval = BACKGROUND_THREAD_INDEFINITE_SLEEP;
		goto label_done;
	}

	uint64_t decay_interval_ns = nstime_ns(&decay->interval);
	assert(decay_interval_ns > 0);
	size_t npages = extents_npages_get(extents);
	if (npages == 0) {
		unsigned i;
		for (i = 0; i < SMOOTHSTEP_NSTEPS; i++) {
			if (decay->backlog[i] > 0) {
				break;
			}
		}
		if (i == SMOOTHSTEP_NSTEPS) {
			/* No dirty pages recorded.  Sleep indefinitely. */
			interval = BACKGROUND_THREAD_INDEFINITE_SLEEP;
			goto label_done;
		}
	}
	if (npages <= BACKGROUND_THREAD_NPAGES_THRESHOLD) {
		/* Use max interval. */
		interval = decay_interval_ns * SMOOTHSTEP_NSTEPS;
		goto label_done;
	}

	size_t lb = BACKGROUND_THREAD_MIN_INTERVAL_NS / decay_interval_ns;
	size_t ub = SMOOTHSTEP_NSTEPS;
	/* Minimal 2 intervals to ensure reaching next epoch deadline. */
	lb = (lb < 2) ? 2 : lb;
	if ((decay_interval_ns * ub <= BACKGROUND_THREAD_MIN_INTERVAL_NS) ||
	    (lb + 2 > ub)) {
		interval = BACKGROUND_THREAD_MIN_INTERVAL_NS;
		goto label_done;
	}

	assert(lb + 2 <= ub);
	size_t npurge_lb, npurge_ub;
	npurge_lb = decay_npurge_after_interval(decay, lb);
	if (npurge_lb > BACKGROUND_THREAD_NPAGES_THRESHOLD) {
		interval = decay_interval_ns * lb;
		goto label_done;
	}
	npurge_ub = decay_npurge_after_interval(decay, ub);
	if (npurge_ub < BACKGROUND_THREAD_NPAGES_THRESHOLD) {
		interval = decay_interval_ns * ub;
		goto label_done;
	}

	unsigned n_search = 0;
	size_t target, npurge;
	while ((npurge_lb + BACKGROUND_THREAD_NPAGES_THRESHOLD < npurge_ub)
	    && (lb + 2 < ub)) {
		target = (lb + ub) / 2;
		npurge = decay_npurge_after_interval(decay, target);
		if (npurge > BACKGROUND_THREAD_NPAGES_THRESHOLD) {
			ub = target;
			npurge_ub = npurge;
		} else {
			lb = target;
			npurge_lb = npurge;
		}
		assert(n_search++ < lg_floor(SMOOTHSTEP_NSTEPS) + 1);
	}
	interval = decay_interval_ns * (ub + lb) / 2;
label_done:
	interval = (interval < BACKGROUND_THREAD_MIN_INTERVAL_NS) ?
	    BACKGROUND_THREAD_MIN_INTERVAL_NS : interval;
	malloc_mutex_unlock(tsdn, &decay->mtx);

	return interval;
}